

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

pair<signed_char,_short> __thiscall node::getFromSrc(node *this,string *src)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  char *__nptr;
  uint uVar6;
  __type _Var7;
  pair<bool,_short> local_7c;
  arrowType *paStack_78;
  pair<bool,_short> p_8;
  arrowType *a_3;
  arrowType *paStack_68;
  pair<bool,_short> p_7;
  arrowType *a_2;
  arrowType *paStack_58;
  pair<bool,_short> p_6;
  arrowType *a_1;
  arrowType *paStack_48;
  pair<bool,_short> p_5;
  arrowType *a;
  pair<bool,_short> local_38;
  pair<bool,_short> p_4;
  pair<bool,_short> p_3;
  pair<bool,_short> p_2;
  int num;
  int i;
  pair<bool,_short> p_1;
  pair<bool,_short> p;
  string *src_local;
  node *this_local;
  
  _p_1 = src;
  lVar5 = std::__cxx11::string::find_first_not_of((char *)src,0x11f164);
  if (lVar5 == -1) {
    std::pair<bool,_short>::pair<bool,_short,_true>((pair<bool,_short> *)&i);
    i._0_1_ = 1;
    __nptr = (char *)std::__cxx11::string::c_str();
    iVar3 = atoi(__nptr);
    i._2_2_ = (undefined2)iVar3;
    std::pair<signed_char,_short>::pair<bool,_short,_true>
              ((pair<signed_char,_short> *)((long)&this_local + 4),(pair<bool,_short> *)&i);
  }
  else {
    bVar2 = std::operator==(src,"ANY");
    if (bVar2) {
      std::pair<bool,_short>::pair<bool,_short,_true>((pair<bool,_short> *)&num);
      p_2.first = false;
      p_2._1_1_ = 0;
      p_2.second = 0;
      for (; (int)p_2 < 4; p_2 = (pair<bool,_short>)((int)p_2 + 1)) {
        _Var7 = std::floor<int>(((int)p_2 + 1) / 2);
        uVar6 = ((int)p_2 + 3) % 4 - (int)_Var7 % 2;
        uVar4 = uVar6;
        if ((int)uVar6 < 1) {
          uVar4 = -uVar6;
        }
        uVar6 = (*this->arrows[(int)uVar4]->_vptr_arrowType[1])
                          (this->arrows[(int)uVar4],(ulong)(uint)(int)(char)this->nodeId,
                           (ulong)-uVar6,CONCAT71((int7)(int3)(uVar4 >> 8),this->nodeId));
        if ((uVar6 & 1) != 0) {
          num._0_1_ = 1;
          iVar3 = (*this->arrows[(int)uVar4]->_vptr_arrowType[2])
                            (this->arrows[(int)uVar4],(ulong)(uint)(int)(char)this->nodeId);
          num._2_2_ = (undefined2)iVar3;
          std::pair<signed_char,_short>::pair<bool,_short,_true>
                    ((pair<signed_char,_short> *)((long)&this_local + 4),(pair<bool,_short> *)&num);
          return this_local._4_4_;
        }
      }
      num._0_1_ = 0;
      std::pair<signed_char,_short>::pair<bool,_short,_true>
                ((pair<signed_char,_short> *)((long)&this_local + 4),(pair<bool,_short> *)&num);
    }
    else {
      bVar2 = std::operator==(src,"LAST");
      if (bVar2) {
        if (this->last == '\x05') {
          std::pair<bool,_short>::pair<bool,_short,_true>(&p_4);
          p_4.first = true;
          p_4.second = 0;
          std::pair<signed_char,_short>::pair<bool,_short,_true>
                    ((pair<signed_char,_short> *)((long)&this_local + 4),&p_4);
          return this_local._4_4_;
        }
        if (this->last == '\0') {
          std::__cxx11::string::operator=((string *)src,"UP");
        }
        else if (this->last == '\x01') {
          std::__cxx11::string::operator=((string *)src,"RIGHT");
        }
        else if (this->last == '\x02') {
          std::__cxx11::string::operator=((string *)src,"DOWN");
        }
        else if (this->last == '\x03') {
          std::__cxx11::string::operator=((string *)src,"LEFT");
        }
      }
      bVar2 = std::operator==(src,"ACC");
      if (bVar2) {
        std::pair<bool,_short>::pair<bool,_short,_true>(&local_38);
        local_38.first = true;
        local_38.second = this->acc;
        std::pair<signed_char,_short>::pair<bool,_short,_true>
                  ((pair<signed_char,_short> *)((long)&this_local + 4),&local_38);
      }
      else {
        bVar2 = std::operator==(src,"NIL");
        if (bVar2) {
          std::pair<bool,_short>::pair<bool,_short,_true>((pair<bool,_short> *)((long)&a + 4));
          a._4_1_ = 1;
          a._6_2_ = 0;
          std::pair<signed_char,_short>::pair<bool,_short,_true>
                    ((pair<signed_char,_short> *)((long)&this_local + 4),
                     (pair<bool,_short> *)((long)&a + 4));
        }
        else {
          bVar2 = std::operator==(src,"LEFT");
          if (bVar2) {
            paStack_48 = this->arrows[3];
            std::pair<bool,_short>::pair<bool,_short,_true>((pair<bool,_short> *)((long)&a_1 + 4));
            uVar4 = (*paStack_48->_vptr_arrowType[1])
                              (paStack_48,(ulong)(uint)(int)(char)this->nodeId);
            if ((uVar4 & 1) == 0) {
              a_1._4_1_ = 0;
            }
            else {
              a_1._4_1_ = 1;
              iVar3 = (*paStack_48->_vptr_arrowType[2])
                                (paStack_48,(ulong)(uint)(int)(char)this->nodeId);
              a_1._6_2_ = (undefined2)iVar3;
            }
            (*paStack_48->_vptr_arrowType[5])();
            std::pair<signed_char,_short>::pair<bool,_short,_true>
                      ((pair<signed_char,_short> *)((long)&this_local + 4),
                       (pair<bool,_short> *)((long)&a_1 + 4));
          }
          else {
            bVar2 = std::operator==(src,"RIGHT");
            if (bVar2) {
              paStack_58 = this->arrows[1];
              std::pair<bool,_short>::pair<bool,_short,_true>((pair<bool,_short> *)((long)&a_2 + 4))
              ;
              uVar4 = (*paStack_58->_vptr_arrowType[1])
                                (paStack_58,(ulong)(uint)(int)(char)this->nodeId);
              if ((uVar4 & 1) == 0) {
                a_2._4_1_ = 0;
              }
              else {
                a_2._4_1_ = 1;
                iVar3 = (*paStack_58->_vptr_arrowType[2])
                                  (paStack_58,(ulong)(uint)(int)(char)this->nodeId);
                a_2._6_2_ = (undefined2)iVar3;
              }
              (*paStack_58->_vptr_arrowType[5])();
              std::pair<signed_char,_short>::pair<bool,_short,_true>
                        ((pair<signed_char,_short> *)((long)&this_local + 4),
                         (pair<bool,_short> *)((long)&a_2 + 4));
            }
            else {
              bVar2 = std::operator==(src,"UP");
              if (bVar2) {
                paStack_68 = this->arrows[0];
                std::pair<bool,_short>::pair<bool,_short,_true>
                          ((pair<bool,_short> *)((long)&a_3 + 4));
                uVar4 = (*paStack_68->_vptr_arrowType[1])
                                  (paStack_68,(ulong)(uint)(int)(char)this->nodeId);
                if ((uVar4 & 1) == 0) {
                  a_3._4_1_ = 0;
                }
                else {
                  a_3._4_1_ = 1;
                  iVar3 = (*paStack_68->_vptr_arrowType[2])
                                    (paStack_68,(ulong)(uint)(int)(char)this->nodeId);
                  a_3._6_2_ = (undefined2)iVar3;
                }
                (*paStack_68->_vptr_arrowType[5])();
                std::pair<signed_char,_short>::pair<bool,_short,_true>
                          ((pair<signed_char,_short> *)((long)&this_local + 4),
                           (pair<bool,_short> *)((long)&a_3 + 4));
              }
              else {
                bVar2 = std::operator==(src,"DOWN");
                if (!bVar2) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                paStack_78 = this->arrows[2];
                std::pair<bool,_short>::pair<bool,_short,_true>(&local_7c);
                uVar4 = (*paStack_78->_vptr_arrowType[1])
                                  (paStack_78,(ulong)(uint)(int)(char)this->nodeId);
                if ((uVar4 & 1) == 0) {
                  local_7c.first = false;
                }
                else {
                  local_7c.first = true;
                  iVar3 = (*paStack_78->_vptr_arrowType[2])
                                    (paStack_78,(ulong)(uint)(int)(char)this->nodeId);
                  local_7c.second = (short)iVar3;
                }
                (*paStack_78->_vptr_arrowType[5])();
                std::pair<signed_char,_short>::pair<bool,_short,_true>
                          ((pair<signed_char,_short> *)((long)&this_local + 4),&local_7c);
              }
            }
          }
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

pair<int8_t, int16_t> node::getFromSrc(string src) {
  if(src.find_first_not_of("0123456789") == std::string::npos) {
    // Then src is just a number
    pair<bool, int16_t> p;
    p.first = READY;
    try{
      p.second = atoi(src.c_str());
    }
    catch(...){
      p.first = INVALID;
      return p;
    }
    return p;
  } else {
    if(src=="ANY"){
      pair<bool, int16_t> p;
      for(int i=0;i<4;i++){
	int num=abs((i+3)%4-(int)floor((i+1)/2)%2);            //Ask Tyler
	if (arrows[num]->getRequest(nodeId)){
	  p.first = true;
	  p.second = arrows[num]->nodeGet(nodeId);
	  return p;
	}
      }
      p.first=false;
      return p;
    }
    if(src=="LAST"){
      if(last==5){
	pair<bool, int16_t> p;
	p.first=true;
	p.second=0;
	return p;
      }
      else{
	if(last==0)
	  src="UP";
	else if(last==1)
	  src="RIGHT";
	else if(last==2)
	  src="DOWN";
	else if(last==3)
	  src="LEFT";
      }
    }
    if(src == "ACC") {
      pair<bool, int16_t> p;
      p.first = true;
      p.second = this->acc;
      return p;
    } else if (src ==  "NIL") {
      pair<bool, int16_t> p;
      p.first = true;
      p.second = 0;
      return p;
    } else if (src ==  "LEFT") {
      arrowType *a = arrows[3];
      pair<bool, int16_t> p;

      if (a->getRequest(nodeId)) {
        p.first = true;
        p.second = a->nodeGet(nodeId);
      } else {
        p.first = false;
      }
      a->updateValues();
      return p;
    } else if (src ==  "RIGHT") {
    	arrowType *a = arrows[1];
      pair<bool, int16_t> p;

      if (a->getRequest(nodeId)) {
        p.first = true;
        p.second = a->nodeGet(nodeId);
      } else {
        p.first = false;
      }
      a->updateValues();
      return p;
    } else if (src ==  "UP") {
    	arrowType *a = arrows[0];
	pair<bool, int16_t> p;

      if (a->getRequest(nodeId)){
        p.first = true;
        p.second = a->nodeGet(nodeId);
      } else {
        p.first = false;
      }
      a->updateValues();
      return p;
    } else if (src ==  "DOWN") {
    	arrowType *a = arrows[2];
      pair<bool, int16_t> p;

      if (a->getRequest(nodeId)) {
        p.first = true;
        p.second = a->nodeGet(nodeId);
      } else {
        p.first = false;
      }
      a->updateValues();
      return p;
    }
  }
  // ANY and LAST are for the future (hopefully not)
}